

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O1

SEQNUM __thiscall FIX::SessionState::getNextSenderMsgSeqNum(SessionState *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  
  Mutex::lock(&this->m_mutex);
  iVar2 = (*this->m_pStore->_vptr_MessageStore[4])();
  iVar1 = (this->m_mutex).m_count;
  (this->m_mutex).m_count = iVar1 + -1;
  if (iVar1 < 2) {
    (this->m_mutex).m_threadID = 0;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  }
  return CONCAT44(extraout_var,iVar2);
}

Assistant:

EXCEPT(IOException) {
    Locker l(m_mutex);
    return m_pStore->getNextSenderMsgSeqNum();
  }